

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

String * __thiscall
capnp::compiler::CompilerMain::readOneJson
          (String *__return_storage_ptr__,CompilerMain *this,BufferedInputStreamWrapper *input)

{
  uchar uVar1;
  byte bVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t extraout_RDX;
  char cVar4;
  size_t sVar5;
  Array<char> *__return_storage_ptr___00;
  int iVar6;
  Vector<char> chars;
  ArrayPtr<const_unsigned_char> buffer;
  ArrayPtr<const_unsigned_char> local_70;
  Array<char> local_60;
  Array<char> local_48;
  
  chars.builder.ptr = (char *)0x0;
  chars.builder.pos = (RemoveConst<char> *)0x0;
  chars.builder.endPtr = (char *)0x0;
  chars.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  bVar2 = 0;
  iVar6 = 0;
  cVar4 = '\0';
  do {
    iVar3 = (*(input->super_BufferedInputStream).super_InputStream._vptr_InputStream[4])(input);
    buffer.ptr = (uchar *)CONCAT44(extraout_var,iVar3);
    if (extraout_RDX == 0) {
      local_70.ptr = (uchar *)((ulong)local_70.ptr & 0xffffffffffffff00);
      kj::Vector<char>::add<char>(&chars,(char *)&local_70);
      __return_storage_ptr___00 = &local_48;
      kj::Vector<char>::releaseAsArray(__return_storage_ptr___00,&chars);
LAB_001209af:
      (__return_storage_ptr__->content).ptr = __return_storage_ptr___00->ptr;
      (__return_storage_ptr__->content).size_ = __return_storage_ptr___00->size_;
      (__return_storage_ptr__->content).disposer = __return_storage_ptr___00->disposer;
      __return_storage_ptr___00->ptr = (char *)0x0;
      __return_storage_ptr___00->size_ = 0;
      kj::Array<char>::~Array(__return_storage_ptr___00);
      kj::ArrayBuilder<char>::dispose(&chars.builder);
      return __return_storage_ptr__;
    }
    for (sVar5 = 0; extraout_RDX != sVar5; sVar5 = sVar5 + 1) {
      uVar1 = buffer.ptr[sVar5];
      if (cVar4 == '\0') {
        if (uVar1 == '#') {
LAB_0012090d:
          cVar4 = '\x02';
        }
        else if (uVar1 == '}') {
LAB_001208fd:
          if (iVar6 == 0) {
            iVar6 = 0;
          }
          else {
            iVar6 = iVar6 + -1;
            bVar2 = bVar2 | iVar6 == 0;
          }
        }
        else {
          if (uVar1 == '{') goto LAB_00120912;
          if (uVar1 == '/') {
            cVar4 = '\x01';
          }
        }
      }
      else if (cVar4 == '\x02') {
        cVar4 = (uVar1 != '\n') * '\x02';
      }
      else {
        if ((uVar1 == '#') || (uVar1 == '/')) goto LAB_0012090d;
        if (uVar1 == '{') {
LAB_00120912:
          if ((bool)(iVar6 == 0 & bVar2)) {
            local_70.ptr = buffer.ptr;
            local_70.size_ = sVar5;
            kj::Vector<char>::addAll<kj::ArrayPtr<unsigned_char_const>>(&chars,&local_70);
            local_70.ptr = (uchar *)((ulong)local_70.ptr & 0xffffffffffffff00);
            kj::Vector<char>::add<char>(&chars,(char *)&local_70);
            (*(input->super_BufferedInputStream).super_InputStream._vptr_InputStream[3])
                      (input,sVar5);
            __return_storage_ptr___00 = &local_60;
            kj::Vector<char>::releaseAsArray(__return_storage_ptr___00,&chars);
            goto LAB_001209af;
          }
          iVar6 = iVar6 + 1;
        }
        else if (uVar1 == '}') goto LAB_001208fd;
      }
    }
    buffer.size_ = extraout_RDX;
    kj::Vector<char>::addAll<kj::ArrayPtr<unsigned_char_const>&>(&chars,&buffer);
    (*(input->super_BufferedInputStream).super_InputStream._vptr_InputStream[3])(input,buffer.size_)
    ;
  } while( true );
}

Assistant:

kj::String readOneJson(kj::BufferedInputStreamWrapper& input) {
    // Consume and return one brace-delimited message from the input.
    //
    // Accounts for nested braces, string literals, and comments starting with # or //. Technically
    // JSON does not permit comments but this code is lenient in case we change things later.

    enum {
      NORMAL,
      SLASH,
      COMMENT,
      QUOTE,
      QUOTE_ESCAPE,
      DQUOTE,
      DQUOTE_ESCAPE
    } state = NORMAL;
    uint depth = 0;
    bool sawClose = false;

    kj::Vector<char> chars;

    for (;;) {
      auto buffer = input.tryGetReadBuffer();

      if (buffer == nullptr) {
        // EOF
        chars.add('\0');
        return kj::String(chars.releaseAsArray());
      }

      for (auto i: kj::indices(buffer)) {
        char c = buffer[i];
        switch (state) {
          case SLASH:
            if (c == '/') {
              state = COMMENT;
              break;
            }
            KJ_FALLTHROUGH;
          case NORMAL:
            switch (c) {
              case '#': state = COMMENT; break;
              case '/': state = SLASH; break;
              case '{':
                if (depth == 0 && sawClose) {
                  // We already got one complete message. This is the start of the next message.
                  // Stop here.
                  chars.addAll(buffer.first(i));
                  chars.add('\0');
                  input.skip(i);
                  return kj::String(chars.releaseAsArray());
                }
                ++depth;
                break;
              case '}':
                if (depth > 0) {
                  if (--depth == 0) {
                    sawClose = true;
                  }
                }
                break;
              default: break;
            }
            break;
          case COMMENT:
            switch (c) {
              case '\n': state = NORMAL; break;
              default: break;
            }
            break;
          case QUOTE:
            switch (c) {
              case '\'': state = NORMAL; break;
              case '\\': state = QUOTE_ESCAPE; break;
              default: break;
            }
            break;
          case QUOTE_ESCAPE:
            break;
          case DQUOTE:
            switch (c) {
              case '\"': state = NORMAL; break;
              case '\\': state = DQUOTE_ESCAPE; break;
              default: break;
            }
            break;
          case DQUOTE_ESCAPE:
            break;
        }
      }

      chars.addAll(buffer);
      input.skip(buffer.size());
    }
  }